

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_fwd.hpp
# Opt level: O0

error_info *
toml::detail::make_error_info_rec<toml::source_location,char_const(&)[21]>
          (error_info *e,source_location *loc,string *msg,source_location *tail,char (*tail_1) [21])

{
  source_location *in_RDX;
  source_location *in_RDI;
  allocator<char> *in_R9;
  source_location *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  allocator<char> local_1b9 [177];
  string *in_stack_fffffffffffffef8;
  source_location *in_stack_ffffffffffffff00;
  error_info *in_stack_ffffffffffffff08;
  
  this = in_RDI;
  source_location::source_location(in_RDI,in_RDX);
  std::__cxx11::string::string(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  error_info::add_locations((error_info *)this,in_RDX,(string *)0x767436);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  source_location::~source_location(this);
  error_info::error_info((error_info *)this,(error_info *)in_RDX);
  source_location::source_location(this,in_RDX);
  __s = local_1b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffe30,(char *)__s,in_R9);
  make_error_info_rec<>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_1b9);
  source_location::~source_location(this);
  error_info::~error_info((error_info *)this);
  return (error_info *)in_RDI;
}

Assistant:

error_info make_error_info_rec(error_info e,
        source_location loc, std::string msg, Ts&& ... tail)
{
    e.add_locations(std::move(loc), std::move(msg));
    return make_error_info_rec(std::move(e), std::forward<Ts>(tail)...);
}